

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_panel.cxx
# Opt level: O1

Fl_Double_Window * make_codeblock_panel(void)

{
  uint *puVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  Fl_Double_Window *this;
  Fl_Input *pFVar5;
  int iVar6;
  Fl_Window *this_00;
  Fl_Widget *pFVar7;
  Fl_Group *pFVar8;
  Fl_Window *this_01;
  Fl_Button *this_02;
  Fl_Group *pFVar9;
  
  this_00 = (Fl_Window *)operator_new(0xf0);
  Fl_Double_Window::Fl_Double_Window((Fl_Double_Window *)this_00,300,0x73,"Code Block Properties");
  codeblock_panel = (Fl_Double_Window *)this_00;
  (this_00->super_Fl_Group).super_Fl_Widget.label_.size = 0xb;
  pFVar7 = (Fl_Widget *)operator_new(200);
  Fl_Input::Fl_Input((Fl_Input *)pFVar7,10,0xf,0x118,0x14,"Conditional code block");
  code_before_input = (Fl_Input *)pFVar7;
  Fl_Widget::tooltip(pFVar7,"#ifdef or similar conditional code block.");
  pFVar5 = code_before_input;
  (code_before_input->super_Fl_Input_).super_Fl_Widget.label_.size = 0xb;
  (pFVar5->super_Fl_Input_).textfont_ = 4;
  (pFVar5->super_Fl_Input_).textsize_ = 0xb;
  (pFVar5->super_Fl_Input_).super_Fl_Widget.label_.align_ = 5;
  (pFVar5->super_Fl_Input_).super_Fl_Widget.when_ = '\0';
  pFVar7 = (Fl_Widget *)operator_new(200);
  Fl_Input::Fl_Input((Fl_Input *)pFVar7,10,0x37,0x118,0x14,"\"{...child code...}\" is inserted here"
                    );
  code_after_input = (Fl_Input *)pFVar7;
  Fl_Widget::tooltip(pFVar7,"#endif or similar conditional code block.");
  pFVar5 = code_after_input;
  (code_after_input->super_Fl_Input_).super_Fl_Widget.label_.size = 0xb;
  (pFVar5->super_Fl_Input_).textfont_ = 4;
  (pFVar5->super_Fl_Input_).textsize_ = 0xb;
  (pFVar5->super_Fl_Input_).super_Fl_Widget.label_.align_ = 5;
  (pFVar5->super_Fl_Input_).super_Fl_Widget.when_ = '\0';
  pFVar8 = Fl_Group::current();
  pFVar8->resizable_ = (Fl_Widget *)code_after_input;
  pFVar8 = (Fl_Group *)operator_new(0xa0);
  Fl_Group::Fl_Group(pFVar8,10,0x55,0x118,0x14,(char *)0x0);
  pFVar7 = (Fl_Widget *)operator_new(0x80);
  Fl_Return_Button::Fl_Return_Button((Fl_Return_Button *)pFVar7,0xa0,0x55,0x3c,0x14,"OK");
  codeblock_panel_ok = (Fl_Return_Button *)pFVar7;
  (pFVar7->label_).size = 0xb;
  this_01 = Fl_Widget::window(pFVar7);
  Fl_Window::hotspot(this_01,(Fl_Widget *)codeblock_panel_ok,0);
  this_02 = (Fl_Button *)operator_new(0x80);
  Fl_Button::Fl_Button(this_02,0xe6,0x55,0x3c,0x14,"Cancel");
  codeblock_panel_cancel = this_02;
  this_02->shortcut_ = 0xff1b;
  (this_02->super_Fl_Widget).label_.size = 0xb;
  pFVar7 = (Fl_Widget *)operator_new(0x78);
  Fl_Box::Fl_Box((Fl_Box *)pFVar7,10,0x55,0x8c,0x14,(char *)0x0);
  pFVar9 = Fl_Group::current();
  pFVar9->resizable_ = pFVar7;
  Fl_Group::end(pFVar8);
  iVar3 = (this_00->super_Fl_Group).super_Fl_Widget.w_;
  iVar4 = (this_00->super_Fl_Group).super_Fl_Widget.h_;
  iVar6 = Fl::w();
  iVar2 = (this_00->super_Fl_Group).super_Fl_Widget.h_;
  this_00->minw = iVar3;
  this_00->minh = iVar4;
  this_00->maxw = iVar6;
  this_00->maxh = iVar2;
  this_00->dw = 0;
  this_00->dh = 0;
  this_00->aspect = 0;
  Fl_Window::size_range_(this_00);
  this = codeblock_panel;
  puVar1 = &(codeblock_panel->super_Fl_Window).super_Fl_Group.super_Fl_Widget.flags_;
  *puVar1 = *puVar1 | 0x4000;
  Fl_Group::end((Fl_Group *)this);
  return codeblock_panel;
}

Assistant:

Fl_Double_Window* make_codeblock_panel() {
  { Fl_Double_Window* o = codeblock_panel = new Fl_Double_Window(300, 115, "Code Block Properties");
    codeblock_panel->labelsize(11);
    { code_before_input = new Fl_Input(10, 15, 280, 20, "Conditional code block");
      code_before_input->tooltip("#ifdef or similar conditional code block.");
      code_before_input->labelsize(11);
      code_before_input->textfont(4);
      code_before_input->textsize(11);
      code_before_input->align(Fl_Align(FL_ALIGN_TOP_LEFT));
      code_before_input->when(FL_WHEN_NEVER);
    } // Fl_Input* code_before_input
    { code_after_input = new Fl_Input(10, 55, 280, 20, "\"{...child code...}\" is inserted here");
      code_after_input->tooltip("#endif or similar conditional code block.");
      code_after_input->labelsize(11);
      code_after_input->textfont(4);
      code_after_input->textsize(11);
      code_after_input->align(Fl_Align(FL_ALIGN_TOP_LEFT));
      code_after_input->when(FL_WHEN_NEVER);
      Fl_Group::current()->resizable(code_after_input);
    } // Fl_Input* code_after_input
    { Fl_Group* o = new Fl_Group(10, 85, 280, 20);
      { codeblock_panel_ok = new Fl_Return_Button(160, 85, 60, 20, "OK");
        codeblock_panel_ok->labelsize(11);
        codeblock_panel_ok->window()->hotspot(codeblock_panel_ok);
      } // Fl_Return_Button* codeblock_panel_ok
      { codeblock_panel_cancel = new Fl_Button(230, 85, 60, 20, "Cancel");
        codeblock_panel_cancel->shortcut(0xff1b);
        codeblock_panel_cancel->labelsize(11);
      } // Fl_Button* codeblock_panel_cancel
      { Fl_Box* o = new Fl_Box(10, 85, 140, 20);
        Fl_Group::current()->resizable(o);
      } // Fl_Box* o
      o->end();
    } // Fl_Group* o
    o->size_range(o->w(), o->h(), Fl::w(), o->h());
    codeblock_panel->set_modal();
    codeblock_panel->end();
  } // Fl_Double_Window* codeblock_panel
  return codeblock_panel;
}